

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

char * FBehavior::StaticLookupString(DWORD index)

{
  FBehavior *pFVar1;
  uint *puVar2;
  uint uVar3;
  DWORD *list;
  char *pcVar4;
  uint *puVar5;
  int iVar6;
  
  uVar3 = index >> 0x14;
  if (uVar3 == 0x7ff) {
    pcVar4 = ACSStringPool::GetString(&GlobalACSStrings,index);
    return pcVar4;
  }
  if (uVar3 < StaticModules.Count) {
    pFVar1 = StaticModules.Array[uVar3];
    if ((ulong)pFVar1->StringTable != 0) {
      puVar5 = (uint *)((ulong)pFVar1->StringTable + (long)pFVar1->Data);
      if (pFVar1->Format == ACS_Old) {
        iVar6 = 1;
        uVar3 = *puVar5;
        puVar2 = (uint *)pFVar1->Data;
      }
      else {
        iVar6 = 3;
        uVar3 = puVar5[1];
        puVar2 = puVar5;
      }
      if ((index & 0xffff) < uVar3) {
        return (char *)((ulong)puVar5[iVar6 + (index & 0xffff)] + (long)puVar2);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *FBehavior::StaticLookupString (DWORD index)
{
	DWORD lib = index >> LIBRARYID_SHIFT;

	if (lib == STRPOOL_LIBRARYID)
	{
		return GlobalACSStrings.GetString(index);
	}
	if (lib >= (DWORD)StaticModules.Size())
	{
		return NULL;
	}
	return StaticModules[lib]->LookupString (index & 0xffff);
}